

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_const_impl.h
# Opt level: O0

void secp256k1_ecmult_const(secp256k1_gej *r,secp256k1_ge *a,secp256k1_scalar *scalar,int size)

{
  int in_ECX;
  undefined8 *in_RDX;
  void *in_RSI;
  secp256k1_gej tmpj;
  secp256k1_ge_storage a2_stor;
  secp256k1_ge_storage correction_1_stor;
  secp256k1_ge correction;
  secp256k1_fe neg_y_1;
  int idx_n_1;
  int abs_n_1;
  int m_1;
  int j;
  int n;
  secp256k1_fe neg_y;
  int idx_n;
  int abs_n;
  int m;
  int rsize;
  secp256k1_scalar sc;
  int i;
  int wnaf_1 [65];
  int skew_1;
  secp256k1_fe Z;
  secp256k1_ge tmpa;
  secp256k1_ge pre_a [8];
  secp256k1_gej *a_00;
  secp256k1_gej *r_00;
  secp256k1_gej *in_stack_fffffffffffff9b8;
  secp256k1_ge *in_stack_fffffffffffff9c0;
  int in_stack_fffffffffffff9c8;
  int in_stack_fffffffffffff9cc;
  int *in_stack_fffffffffffff9d0;
  secp256k1_scalar in_stack_fffffffffffff9e0;
  secp256k1_fe *in_stack_fffffffffffffa00;
  secp256k1_gej *in_stack_fffffffffffffa08;
  secp256k1_gej *in_stack_fffffffffffffa10;
  undefined1 local_570 [88];
  secp256k1_fe local_518;
  int local_4ec;
  int local_4e8;
  int local_4e4;
  int local_4e0;
  int local_4dc;
  secp256k1_fe local_4d8;
  int local_4b0;
  int local_4ac;
  int local_4a8;
  int local_4a4;
  secp256k1_gej *local_4a0;
  secp256k1_gej *local_498;
  undefined8 local_490;
  undefined8 local_488;
  undefined4 in_stack_fffffffffffffb80;
  int iVar1;
  secp256k1_gej *in_stack_fffffffffffffb88;
  secp256k1_gej *in_stack_fffffffffffffb90;
  secp256k1_fe local_340;
  secp256k1_fe sStack_318;
  undefined4 local_2f0;
  secp256k1_fe local_2e8 [9];
  secp256k1_gej *in_stack_fffffffffffffea0;
  secp256k1_fe *in_stack_fffffffffffffea8;
  secp256k1_ge *in_stack_fffffffffffffeb0;
  
  a_00 = (secp256k1_gej *)*in_RDX;
  r_00 = (secp256k1_gej *)in_RDX[1];
  local_490 = in_RDX[2];
  local_488 = in_RDX[3];
  local_4a4 = in_ECX;
  local_4a0 = a_00;
  local_498 = r_00;
  secp256k1_wnaf_const
            (in_stack_fffffffffffff9d0,in_stack_fffffffffffff9e0,in_stack_fffffffffffff9cc,
             in_stack_fffffffffffff9c8);
  secp256k1_gej_set_ge(r_00,(secp256k1_ge *)a_00);
  secp256k1_ecmult_odd_multiples_table_globalz_windowa
            (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
  for (iVar1 = 0; iVar1 < 8; iVar1 = iVar1 + 1) {
    secp256k1_fe_normalize_weak((secp256k1_fe *)((long)local_2e8 + (long)iVar1 * 0x58 + 0x28));
  }
  iVar1 = *(int *)(&stack0xfffffffffffffb88 + (long)((local_4a4 + 3) / 4) * 4);
  local_4ac = iVar1 * ((uint)(0 < iVar1) * 2 + -1);
  local_4b0 = local_4ac / 2;
  for (local_4a8 = 0; local_4a8 < 8; local_4a8 = local_4a8 + 1) {
    secp256k1_fe_cmov(&local_340,(secp256k1_fe *)((long)local_2e8 + (long)local_4a8 * 0x58),
                      (uint)(local_4a8 == local_4b0));
    secp256k1_fe_cmov(&sStack_318,(secp256k1_fe *)((long)local_2e8 + (long)local_4a8 * 0x58 + 0x28),
                      (uint)(local_4a8 == local_4b0));
  }
  local_2f0 = 0;
  secp256k1_fe_negate(&local_4d8,&sStack_318,1);
  secp256k1_fe_cmov(&sStack_318,&local_4d8,(uint)(iVar1 != local_4ac));
  secp256k1_gej_set_ge(r_00,(secp256k1_ge *)a_00);
  iVar1 = (local_4a4 + 3) / 4;
  while (iVar1 = iVar1 + -1, -1 < iVar1) {
    for (local_4e0 = 0; local_4e0 < 4; local_4e0 = local_4e0 + 1) {
      secp256k1_gej_double_nonzero(r_00,a_00,(secp256k1_fe *)0x108a6a);
    }
    local_4dc = *(int *)(&stack0xfffffffffffffb88 + (long)iVar1 * 4);
    local_4e8 = local_4dc * ((uint)(0 < local_4dc) * 2 + -1);
    local_4ec = local_4e8 / 2;
    for (local_4e4 = 0; local_4e4 < 8; local_4e4 = local_4e4 + 1) {
      secp256k1_fe_cmov(&local_340,(secp256k1_fe *)((long)local_2e8 + (long)local_4e4 * 0x58),
                        (uint)(local_4e4 == local_4ec));
      secp256k1_fe_cmov(&sStack_318,
                        (secp256k1_fe *)((long)local_2e8 + (long)local_4e4 * 0x58 + 0x28),
                        (uint)(local_4e4 == local_4ec));
    }
    local_2f0 = 0;
    secp256k1_fe_negate(&local_518,&sStack_318,1);
    secp256k1_fe_cmov(&sStack_318,&local_518,(uint)(local_4dc != local_4e8));
    secp256k1_gej_add_ge
              (in_stack_fffffffffffffb90,in_stack_fffffffffffffb88,
               (secp256k1_ge *)CONCAT44(iVar1,in_stack_fffffffffffffb80));
  }
  secp256k1_fe_mul(&r_00->x,&a_00->x,(secp256k1_fe *)0x108c31);
  memcpy(local_570,in_RSI,0x58);
  secp256k1_gej_set_ge(r_00,(secp256k1_ge *)a_00);
  secp256k1_gej_double_var
            (in_stack_fffffffffffffa10,in_stack_fffffffffffffa08,in_stack_fffffffffffffa00);
  secp256k1_ge_set_gej(in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8);
  secp256k1_ge_to_storage
            ((secp256k1_ge_storage *)in_stack_fffffffffffff9c0,
             (secp256k1_ge *)in_stack_fffffffffffff9b8);
  secp256k1_ge_to_storage
            ((secp256k1_ge_storage *)in_stack_fffffffffffff9c0,
             (secp256k1_ge *)in_stack_fffffffffffff9b8);
  secp256k1_ge_storage_cmov((secp256k1_ge_storage *)r_00,(secp256k1_ge_storage *)a_00,0);
  secp256k1_ge_from_storage((secp256k1_ge *)r_00,(secp256k1_ge_storage *)a_00);
  secp256k1_ge_neg((secp256k1_ge *)r_00,(secp256k1_ge *)a_00);
  secp256k1_gej_add_ge
            (in_stack_fffffffffffffb90,in_stack_fffffffffffffb88,
             (secp256k1_ge *)CONCAT44(iVar1,in_stack_fffffffffffffb80));
  return;
}

Assistant:

static void secp256k1_ecmult_const(secp256k1_gej *r, const secp256k1_ge *a, const secp256k1_scalar *scalar, int size) {
    secp256k1_ge pre_a[ECMULT_TABLE_SIZE(WINDOW_A)];
    secp256k1_ge tmpa;
    secp256k1_fe Z;

    int skew_1;
#ifdef USE_ENDOMORPHISM
    secp256k1_ge pre_a_lam[ECMULT_TABLE_SIZE(WINDOW_A)];
    int wnaf_lam[1 + WNAF_SIZE(WINDOW_A - 1)];
    int skew_lam;
    secp256k1_scalar q_1, q_lam;
#endif
    int wnaf_1[1 + WNAF_SIZE(WINDOW_A - 1)];

    int i;
    secp256k1_scalar sc = *scalar;

    /* build wnaf representation for q. */
    int rsize = size;
#ifdef USE_ENDOMORPHISM
    if (size > 128) {
        rsize = 128;
        /* split q into q_1 and q_lam (where q = q_1 + q_lam*lambda, and q_1 and q_lam are ~128 bit) */
        secp256k1_scalar_split_lambda(&q_1, &q_lam, &sc);
        skew_1   = secp256k1_wnaf_const(wnaf_1,   q_1,   WINDOW_A - 1, 128);
        skew_lam = secp256k1_wnaf_const(wnaf_lam, q_lam, WINDOW_A - 1, 128);
    } else
#endif
    {
        skew_1   = secp256k1_wnaf_const(wnaf_1, sc, WINDOW_A - 1, size);
#ifdef USE_ENDOMORPHISM
        skew_lam = 0;
#endif
    }

    /* Calculate odd multiples of a.
     * All multiples are brought to the same Z 'denominator', which is stored
     * in Z. Due to secp256k1' isomorphism we can do all operations pretending
     * that the Z coordinate was 1, use affine addition formulae, and correct
     * the Z coordinate of the result once at the end.
     */
    secp256k1_gej_set_ge(r, a);
    secp256k1_ecmult_odd_multiples_table_globalz_windowa(pre_a, &Z, r);
    for (i = 0; i < ECMULT_TABLE_SIZE(WINDOW_A); i++) {
        secp256k1_fe_normalize_weak(&pre_a[i].y);
    }
#ifdef USE_ENDOMORPHISM
    if (size > 128) {
        for (i = 0; i < ECMULT_TABLE_SIZE(WINDOW_A); i++) {
            secp256k1_ge_mul_lambda(&pre_a_lam[i], &pre_a[i]);
        }
    }
#endif

    /* first loop iteration (separated out so we can directly set r, rather
     * than having it start at infinity, get doubled several times, then have
     * its new value added to it) */
    i = wnaf_1[WNAF_SIZE_BITS(rsize, WINDOW_A - 1)];
    VERIFY_CHECK(i != 0);
    ECMULT_CONST_TABLE_GET_GE(&tmpa, pre_a, i, WINDOW_A);
    secp256k1_gej_set_ge(r, &tmpa);
#ifdef USE_ENDOMORPHISM
    if (size > 128) {
        i = wnaf_lam[WNAF_SIZE_BITS(rsize, WINDOW_A - 1)];
        VERIFY_CHECK(i != 0);
        ECMULT_CONST_TABLE_GET_GE(&tmpa, pre_a_lam, i, WINDOW_A);
        secp256k1_gej_add_ge(r, r, &tmpa);
    }
#endif
    /* remaining loop iterations */
    for (i = WNAF_SIZE_BITS(rsize, WINDOW_A - 1) - 1; i >= 0; i--) {
        int n;
        int j;
        for (j = 0; j < WINDOW_A - 1; ++j) {
            secp256k1_gej_double_nonzero(r, r, NULL);
        }

        n = wnaf_1[i];
        ECMULT_CONST_TABLE_GET_GE(&tmpa, pre_a, n, WINDOW_A);
        VERIFY_CHECK(n != 0);
        secp256k1_gej_add_ge(r, r, &tmpa);
#ifdef USE_ENDOMORPHISM
        if (size > 128) {
            n = wnaf_lam[i];
            ECMULT_CONST_TABLE_GET_GE(&tmpa, pre_a_lam, n, WINDOW_A);
            VERIFY_CHECK(n != 0);
            secp256k1_gej_add_ge(r, r, &tmpa);
        }
#endif
    }

    secp256k1_fe_mul(&r->z, &r->z, &Z);

    {
        /* Correct for wNAF skew */
        secp256k1_ge correction = *a;
        secp256k1_ge_storage correction_1_stor;
#ifdef USE_ENDOMORPHISM
        secp256k1_ge_storage correction_lam_stor;
#endif
        secp256k1_ge_storage a2_stor;
        secp256k1_gej tmpj;
        secp256k1_gej_set_ge(&tmpj, &correction);
        secp256k1_gej_double_var(&tmpj, &tmpj, NULL);
        secp256k1_ge_set_gej(&correction, &tmpj);
        secp256k1_ge_to_storage(&correction_1_stor, a);
#ifdef USE_ENDOMORPHISM
        if (size > 128) {
            secp256k1_ge_to_storage(&correction_lam_stor, a);
        }
#endif
        secp256k1_ge_to_storage(&a2_stor, &correction);

        /* For odd numbers this is 2a (so replace it), for even ones a (so no-op) */
        secp256k1_ge_storage_cmov(&correction_1_stor, &a2_stor, skew_1 == 2);
#ifdef USE_ENDOMORPHISM
        if (size > 128) {
            secp256k1_ge_storage_cmov(&correction_lam_stor, &a2_stor, skew_lam == 2);
        }
#endif

        /* Apply the correction */
        secp256k1_ge_from_storage(&correction, &correction_1_stor);
        secp256k1_ge_neg(&correction, &correction);
        secp256k1_gej_add_ge(r, r, &correction);

#ifdef USE_ENDOMORPHISM
        if (size > 128) {
            secp256k1_ge_from_storage(&correction, &correction_lam_stor);
            secp256k1_ge_neg(&correction, &correction);
            secp256k1_ge_mul_lambda(&correction, &correction);
            secp256k1_gej_add_ge(r, r, &correction);
        }
#endif
    }
}